

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O0

void pzgeom::TPZQuadraticPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *v;
  Fad<double> *e;
  TPZFMatrix<Fad<double>_> *this;
  Fad<double> *fadexpr;
  Fad<double> *col;
  TPZVec<Fad<double>_> *in_RDI;
  double dVar1;
  Fad<double> check;
  Fad<double> zeta;
  Fad<double> eta;
  Fad<double> qsi;
  Fad<double> *in_stack_ffffffffffffd640;
  Fad<double> *in_stack_ffffffffffffd648;
  Fad<double> *in_stack_ffffffffffffd650;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  *in_stack_ffffffffffffd658;
  TPZFMatrix<Fad<double>_> *in_stack_ffffffffffffd660;
  Fad<double> *in_stack_ffffffffffffd670;
  Fad<double> *in_stack_ffffffffffffd678;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *in_stack_ffffffffffffd680;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *in_stack_ffffffffffffd688;
  Fad<double> *in_stack_ffffffffffffd690;
  Fad<double> *in_stack_ffffffffffffd698;
  
  TPZVec<Fad<double>_>::operator[](in_RDI,0);
  Fad<double>::Fad(in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
  TPZVec<Fad<double>_>::operator[](in_RDI,1);
  Fad<double>::Fad(in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
  TPZVec<Fad<double>_>::operator[](in_RDI,2);
  Fad<double>::Fad(in_stack_ffffffffffffd650,in_stack_ffffffffffffd648);
  operator-<Fad<double>,_double,_nullptr>
            (in_stack_ffffffffffffd698,(double)in_stack_ffffffffffffd690);
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadCst<double>>>
            (in_stack_ffffffffffffd690,in_stack_ffffffffffffd688);
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffd640);
  dVar1 = fabs<double>((Fad<double> *)0x1831638);
  if (1e-06 <= dVar1) {
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)0x1832911);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)0x1832b44);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator-<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator-<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator-<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
               0x18336b9);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)0x1833810);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator-<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)0x18339c2);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator-<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator-<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)0x1833d02);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator/<FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)0x18343e4);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>
                *)0x1834644);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator-<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>
                *)0x1834d90);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
                *)0x1834f6f);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    Fad<double>::operator-(in_stack_ffffffffffffd648);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x183537a);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                 *)in_stack_ffffffffffffd648);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)0x1835ac8);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<int,_nullptr>(in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648)
    ;
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<int,_nullptr>(in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648)
    ;
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)0x1835ce1);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
               0x1835ec3);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd698,(double)in_stack_ffffffffffffd690);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=((Fad<double> *)in_stack_ffffffffffffd660,in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator-<double,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator-<double,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd680);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd648);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<double,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((double)in_stack_ffffffffffffd688,in_stack_ffffffffffffd680);
    operator/<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *)
               0x1836b61);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)0x1836c59);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffd678,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd698,(double)in_stack_ffffffffffffd690);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)0x1836f89);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    ::operator-((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)in_stack_ffffffffffffd648);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)0x18370b5);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator-<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    operator/<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),
               (FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd670);
    operator*<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd678,
               in_stack_ffffffffffffd670);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>
              ((int)((ulong)in_stack_ffffffffffffd678 >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd678,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    v = TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
                   (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),in_stack_ffffffffffffd670);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,in_stack_ffffffffffffd670);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)v,in_stack_ffffffffffffd670);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),in_stack_ffffffffffffd670);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)v,(FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd670);
    e = TPZFMatrix<Fad<double>_>::operator()
                  (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
                   (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)e);
    operator/<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              (v,(FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                  *)e);
    operator-<int,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((int)((ulong)v >> 0x20),
               (FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)e);
    operator*<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              (v,(FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)e);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)e);
    operator*<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)v,(FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)e);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)in_stack_ffffffffffffd660,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator-<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)v,e);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (v,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)v,(FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)e);
    this = (TPZFMatrix<Fad<double>_> *)
           TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
                      (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)this,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd658);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator-<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)v,e);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (v,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)v,(FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)e);
    fadexpr = TPZFMatrix<Fad<double>_>::operator()
                        (this,(int64_t)in_stack_ffffffffffffd658,(int64_t)in_stack_ffffffffffffd650)
    ;
    Fad<double>::operator=
              ((Fad<double> *)this,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)fadexpr);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,e);
    operator*<Fad<double>,_Fad<double>,_nullptr>(v,e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)e);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)v,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)e);
    operator+<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)v,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                     *)e);
    operator*<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator-<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)v,(FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)e);
    col = TPZFMatrix<Fad<double>_>::operator()
                    (this,(int64_t)fadexpr,(int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=
              ((Fad<double> *)this,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)fadexpr);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,e);
    operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)v,e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator/<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)v,(FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)e);
    TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)fadexpr,(int64_t)col);
    Fad<double>::operator=
              ((Fad<double> *)this,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)fadexpr);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,e);
    operator*<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_nullptr>
              (v,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                  *)e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)v,(FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)e);
    in_stack_ffffffffffffd640 =
         TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)fadexpr,(int64_t)col);
    Fad<double>::operator=
              ((Fad<double> *)this,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)fadexpr);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator-<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,e);
    operator*<Fad<double>,_Fad<double>,_nullptr>(v,e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator+<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator*<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)v,
               (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)e);
    operator/<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)v,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)e);
    operator-<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
                *)v,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                     *)e);
    operator*<int,_Fad<double>,_nullptr>((int)((ulong)v >> 0x20),e);
    operator-<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)v,(FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)e);
    TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)fadexpr,(int64_t)col);
    Fad<double>::operator=
              ((Fad<double> *)this,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)fadexpr);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_ffffffffffffd640);
    FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)in_stack_ffffffffffffd640);
  }
  else {
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<int,_nullptr>(in_stack_ffffffffffffd650,(int *)in_stack_ffffffffffffd648)
    ;
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
    TPZFMatrix<Fad<double>_>::operator()
              (in_stack_ffffffffffffd660,(int64_t)in_stack_ffffffffffffd658,
               (int64_t)in_stack_ffffffffffffd650);
    Fad<double>::operator=<double,_nullptr>
              (in_stack_ffffffffffffd650,&in_stack_ffffffffffffd648->val_);
  }
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  Fad<double>::~Fad(in_stack_ffffffffffffd640);
  return;
}

Assistant:

void TPZQuadraticPyramid::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = par[0], eta = par[1], zeta = par[2];
    T check = zeta-1.;
    if(fabs(check) < 1.E-6)
    {
        phi(0,0)  = 0.;
        phi(1,0)  = 0.;
        phi(2,0)  = 0.;
        phi(3,0)  = 0.;
        phi(4,0)  = 1.;
        phi(5,0)  = 0.;
        phi(6,0)  = 0.;
        phi(7,0)  = 0.;
        phi(8,0)  = 0.;
        phi(9,0)  = 0.;
        phi(10,0) = 0.;
        phi(11,0) = 0.;
        phi(12,0) = 0.;
        
        dphi(0,0) = 0.;
        dphi(1,0) = 0.;
        dphi(2,0) = -0.25;
        
        dphi(0,1) = 0.;
        dphi(1,1) = 0.;
        dphi(2,1) = -0.25;
        
        dphi(0,2) = 0.;
        dphi(1,2) = 0.;
        dphi(2,2) = -0.25;
        
        dphi(0,3) = 0.;
        dphi(1,3) = 0.;
        dphi(2,3) = -0.25;
        
        dphi(0,4) = 0.;
        dphi(1,4) = 0.;
        dphi(2,4) = 3.;
        
        dphi(0,5) = 0.;
        dphi(1,5) = 0.5;
        dphi(2,5) = 0.5;
        
        dphi(0,6) = -0.5;
        dphi(1,6) = 0.;
        dphi(2,6) = 0.5;
        
        dphi(0,7) = 0.;
        dphi(1,7) = -0.5;
        dphi(2,7) = 0.5;
        
        dphi(0,8) = 0.5;
        dphi(1,8) = 0.;
        dphi(2,8) = 0.5;
        
        dphi(0,9) = -1.;
        dphi(1,9) = -1.;
        dphi(2,9) = -1.;
        
        dphi(0,10) = 1.;
        dphi(1,10) = -1.;
        dphi(2,10) = -1.;
        
        dphi(0,11) = 1.;
        dphi(1,11) = 1.;
        dphi(2,11) = -1.;
        
        dphi(0,12) = -1;
        dphi(1,12) = 1.;
        dphi(2,12) = -1.;
        
        return;
    }

    phi(0,0) = ((1 + eta + qsi)*(-1 + eta + zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(1,0) = -((1 + eta - qsi)*(1 + qsi - zeta)*(-1 + eta + zeta))/(4.*(-1 + zeta));
    phi(2,0) = -((-1 + eta + qsi)*(1 + eta - zeta)*(1 + qsi - zeta))/(4.*(-1 + zeta));
    phi(3,0) = ((-1 + eta - qsi)*(1 + eta - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(4,0) = zeta*(-1 + 2*zeta);
    phi(5,0) = ((-1 + eta + zeta)*(-1 - qsi + zeta)*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(6,0) = ((-1 - eta + zeta)*(-1 + eta + zeta)*(-1 - qsi + zeta))/(2.*(-1 + zeta));
    phi(7,0) = ((qsi*qsi - (-1 + zeta)*(-1 + zeta))*(1 + eta - zeta))/(2.*(-1 + zeta));
    phi(8,0) = ((-(eta*eta) + (-1 + zeta)*(-1 + zeta))*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(9,0) = -((zeta*(-1 + eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));
    phi(10,0) = -((zeta*(-1 + eta + zeta)*(-1 - qsi + zeta))/(-1 + zeta));
    phi(11,0) = ((1 + eta - zeta)*(1 + qsi - zeta)*zeta)/(1 - zeta);
    phi(12,0) = -((zeta*(-1 - eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));


    dphi(0,0) = ((-1 + eta + zeta)*(eta + 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,0) = ((-1 + qsi + zeta)*(2*eta + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,0) = -(eta*eta*qsi + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,1) = -((-1 + eta + zeta)*(eta - 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,1) = ((1 + qsi - zeta)*(-2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,1) = (eta*eta*qsi + eta*(qsi - qsi*qsi + (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,2) = -((1 + eta - zeta)*(eta + 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,2) = -((1 + qsi - zeta)*(2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,2) = (eta*eta*qsi + eta*(-qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,3) = ((1 + eta - zeta)*(eta - 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,3) = ((2*eta - qsi - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,3) = (-(eta*eta*qsi) + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) + (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,4) = 0;
    dphi(1,4) = 0;
    dphi(2,4) = -1 + 4*zeta;

    dphi(0,5) = -((qsi*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,5) = (-(qsi*qsi) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,5) = (-2 + eta + (eta*(qsi*qsi))/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,6) = (eta*eta - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,6) = (eta*(1 + qsi - zeta))/(-1 + zeta);
    dphi(2,6) = -1 + qsi*(-0.5 - (eta*eta)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,7) = (qsi*(1 + eta - zeta))/(-1 + zeta);
    dphi(1,7) = (qsi*qsi - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,7) = -1 + eta*(-0.5 - (qsi*qsi)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,8) = (-(eta*eta) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,8) = -((eta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,8) = (-2 + qsi + (eta*eta*qsi)/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,9) = -((zeta*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,9) = -((zeta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,9) = 1 - qsi + eta*(-1 + qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,10) = (zeta*(-1 + eta + zeta))/(-1 + zeta);
    dphi(1,10) = ((1 + qsi - zeta)*zeta)/(-1 + zeta);
    dphi(2,10) = 1 + qsi + eta*(-1 - qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,11) = (zeta*(-1 - eta + zeta))/(-1 + zeta);
    dphi(1,11) = (zeta*(-1 - qsi + zeta))/(-1 + zeta);
    dphi(2,11) = 1 + eta + qsi + (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;

    dphi(0,12) = ((1 + eta - zeta)*zeta)/(-1 + zeta);
    dphi(1,12) = (zeta*(-1 + qsi + zeta))/(-1 + zeta);
    dphi(2,12) = 1 + eta - qsi - (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;
    
}